

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

CRef __thiscall Minisat::Solver::simplePropagate(Solver *this)

{
  int iVar1;
  CRef CVar2;
  uint uVar3;
  lbool *plVar4;
  VarData *pVVar5;
  Watcher WVar6;
  uint *puVar7;
  vec<Minisat::Watcher> *pvVar8;
  long lVar9;
  int iVar10;
  Watcher *pWVar11;
  byte bVar12;
  int iVar13;
  byte bVar14;
  Watcher *pWVar15;
  vec<Minisat::Watcher> *pvVar16;
  Watcher *pWVar17;
  uint uVar18;
  Watcher w;
  uint local_4c;
  Watcher local_48;
  ulong local_40;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *local_38;
  
  local_38 = &this->watches;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (local_38);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (&this->watches_bin);
  iVar10 = this->qhead;
  local_40 = 0;
  if (iVar10 < (this->trail).sz) {
    local_4c = 0xffffffff;
    do {
      this->qhead = iVar10 + 1;
      pvVar8 = (this->watches_bin).occs.data;
      uVar18 = (this->trail).data[iVar10].x;
      pvVar16 = (this->watches).occs.data + (int)uVar18;
      iVar10 = pvVar8[(int)uVar18].sz;
      if (0 < iVar10) {
        pvVar8 = pvVar8 + (int)uVar18;
        lVar9 = 0;
        do {
          pWVar11 = pvVar8->data;
          iVar1 = pWVar11[lVar9].blocker.x;
          iVar13 = iVar1 >> 1;
          plVar4 = (this->assigns).data;
          bVar12 = plVar4[iVar13].value;
          bVar14 = (byte)iVar1 & 1;
          if ((bVar12 ^ bVar14) == 1) {
            return pWVar11[lVar9].cref;
          }
          if ((bVar12 & 2) != 0) {
            CVar2 = pWVar11[lVar9].cref;
            plVar4[iVar13].value = bVar14;
            pVVar5 = (this->vardata).data;
            pVVar5[iVar13].reason = CVar2;
            pVVar5[iVar13].level = (this->trail_lim).sz;
            iVar10 = (this->trail).sz;
            (this->trail).sz = iVar10 + 1;
            (this->trail).data[iVar10].x = iVar1;
            iVar10 = pvVar8->sz;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar10);
      }
      pWVar15 = pvVar16->data;
      pWVar11 = pWVar15;
      if ((long)pvVar16->sz != 0) {
        pWVar11 = pWVar15 + pvVar16->sz;
        uVar18 = uVar18 ^ 1;
        pWVar17 = pWVar15;
        do {
          uVar3 = (pWVar17->blocker).x;
          plVar4 = (this->assigns).data;
          if (plVar4[(int)uVar3 >> 1].value == ((byte)uVar3 & 1)) {
LAB_00112dfe:
            WVar6 = *pWVar17;
            pWVar17 = pWVar17 + 1;
            *pWVar15 = WVar6;
            pWVar15 = pWVar15 + 1;
          }
          else {
            local_48.cref = pWVar17->cref;
            puVar7 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            local_48.blocker.x = puVar7[(ulong)local_48.cref + 2];
            if (local_48.blocker.x == uVar18) {
              local_48.blocker.x = puVar7[(ulong)local_48.cref + 3];
              puVar7[(ulong)local_48.cref + 2] = local_48.blocker.x;
              puVar7[(ulong)local_48.cref + 3] = uVar18;
            }
            iVar10 = local_48.blocker.x >> 1;
            if ((local_48.blocker.x != uVar3) &&
               (plVar4[iVar10].value == ((byte)local_48.blocker.x & 1))) {
              (pWVar17->blocker).x = local_48.blocker.x;
              goto LAB_00112dfe;
            }
            if (2 < (uint)(*(ulong *)(puVar7 + local_48.cref) >> 0x22)) {
              lVar9 = 0;
              do {
                if (((byte)puVar7[(ulong)local_48.cref + lVar9 + 4] & 1 ^
                    plVar4[(int)puVar7[(ulong)local_48.cref + lVar9 + 4] >> 1].value) != 1) {
                  pWVar17 = pWVar17 + 1;
                  puVar7[(ulong)local_48.cref + 3] = puVar7[(ulong)local_48.cref + lVar9 + 4];
                  puVar7[(ulong)local_48.cref + lVar9 + 4] = uVar18;
                  vec<Minisat::Watcher>::push
                            ((local_38->occs).data +
                             ((long)(int)puVar7[(ulong)local_48.cref + 3] ^ 1),&local_48);
                  goto LAB_00112e0d;
                }
                lVar9 = lVar9 + 1;
              } while ((*(ulong *)(puVar7 + local_48.cref) >> 0x22) - 2 != lVar9);
            }
            (pWVar17->blocker).x = local_48.blocker.x;
            WVar6 = *pWVar17;
            pWVar17 = pWVar17 + 1;
            *pWVar15 = WVar6;
            pWVar15 = pWVar15 + 1;
            plVar4 = (this->assigns).data;
            bVar12 = (byte)local_48.blocker.x & 1;
            if ((plVar4[iVar10].value ^ bVar12) == 1) {
              this->qhead = (this->trail).sz;
              for (; local_4c = local_48.cref, pWVar17 < pWVar11; pWVar17 = pWVar17 + 1) {
                *pWVar15 = *pWVar17;
                pWVar15 = pWVar15 + 1;
              }
            }
            else {
              plVar4[iVar10].value = bVar12;
              pVVar5 = (this->vardata).data;
              pVVar5[iVar10].reason = local_48.cref;
              pVVar5[iVar10].level = (this->trail_lim).sz;
              iVar10 = (this->trail).sz;
              (this->trail).sz = iVar10 + 1;
              (this->trail).data[iVar10].x = local_48.blocker.x;
            }
          }
LAB_00112e0d:
        } while (pWVar17 != pWVar11);
      }
      iVar10 = (int)((ulong)((long)pWVar11 - (long)pWVar15) >> 3);
      if (0 < iVar10) {
        pvVar16->sz = pvVar16->sz - iVar10;
      }
      uVar18 = (int)local_40 + 1;
      local_40 = (ulong)uVar18;
      iVar10 = this->qhead;
    } while (iVar10 < (this->trail).sz);
    local_40 = (ulong)uVar18;
  }
  else {
    local_4c = 0xffffffff;
  }
  this->s_propagations = this->s_propagations + local_40;
  return local_4c;
}

Assistant:

CRef Solver::simplePropagate()
{
    CRef confl = CRef_Undef;
    int num_props = 0;
    watches.cleanAll();
    watches_bin.cleanAll();
    while (qhead < trail.size()) {
        Lit p = trail[qhead++]; // 'p' is enqueued fact to propagate.
        vec<Watcher> &ws = watches[p];
        Watcher *i, *j, *end;
        num_props++;


        // First, Propagate binary clauses
        vec<Watcher> &wbin = watches_bin[p];

        for (int k = 0; k < wbin.size(); k++) {

            Lit imp = wbin[k].blocker;

            if (value(imp) == l_False) {
                return wbin[k].cref;
            }

            if (value(imp) == l_Undef) {
                simpleUncheckEnqueue(imp, wbin[k].cref);
            }
        }
        for (i = j = (Watcher *)ws, end = i + ws.size(); i != end;) {
            // Try to avoid inspecting the clause:
            Lit blocker = i->blocker;
            if (value(blocker) == l_True) {
                *j++ = *i++;
                continue;
            }

            // Make sure the false literal is data[1]:
            CRef cr = i->cref;
            Clause &c = ca[cr];
            Lit false_lit = ~p;
            if (c[0] == false_lit) c[0] = c[1], c[1] = false_lit;
            assert(c[1] == false_lit);
            //  i++;

            // If 0th watch is true, then clause is already satisfied.
            // However, 0th watch is not the blocker, make it blocker using a new watcher w
            // why not simply do i->blocker=first in this case?
            Lit first = c[0];
            //  Watcher w     = Watcher(cr, first);
            if (first != blocker && value(first) == l_True) {
                i->blocker = first;
                *j++ = *i++;
                continue;
            }

            // Look for new watch:
            // if (incremental)
            //{ // ----------------- INCREMENTAL MODE
            //	int choosenPos = -1;
            //	for (int k = 2; k < c.size(); k++)
            //	{
            //		if (value(c[k]) != l_False)
            //		{
            //			if (decisionLevel()>assumptions.size())
            //			{
            //				choosenPos = k;
            //				break;
            //			}
            //			else
            //			{
            //				choosenPos = k;

            //				if (value(c[k]) == l_True || !isSelector(var(c[k]))) {
            //					break;
            //				}
            //			}

            //		}
            //	}
            //	if (choosenPos != -1)
            //	{
            //		// watcher i is abandonned using i++, because cr watches now ~c[k] instead of p
            //		// the blocker is first in the watcher. However,
            //		// the blocker in the corresponding watcher in ~first is not c[1]
            //		Watcher w = Watcher(cr, first); i++;
            //		c[1] = c[choosenPos]; c[choosenPos] = false_lit;
            //		watches[~c[1]].push(w);
            //		goto NextClause;
            //	}
            //}
            else { // ----------------- DEFAULT  MODE (NOT INCREMENTAL)
                for (int k = 2; k < c.size(); k++) {

                    if (value(c[k]) != l_False) {
                        // watcher i is abandonned using i++, because cr watches now ~c[k] instead of p
                        // the blocker is first in the watcher. However,
                        // the blocker in the corresponding watcher in ~first is not c[1]
                        Watcher w = Watcher(cr, first);
                        i++;
                        c[1] = c[k];
                        c[k] = false_lit;
                        watches[~c[1]].push(w);
                        goto NextClause;
                    }
                }
            }

            // Did not find watch -- clause is unit under assignment:
            i->blocker = first;
            *j++ = *i++;
            if (value(first) == l_False) {
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while (i < end) *j++ = *i++;
            } else {
                simpleUncheckEnqueue(first, cr);
            }
        NextClause:;
        }
        ws.shrink(i - j);
    }

    s_propagations += num_props;

    return confl;
}